

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_internal_aes_decrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t Y3;
  uint32_t Y2;
  uint32_t Y1;
  uint32_t Y0;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uchar *local_40;
  uint *local_38;
  
  puVar4 = ctx->rk;
  uVar5 = *(uint *)input ^ *puVar4;
  uVar6 = *(uint *)(input + 4) ^ puVar4[1];
  uVar10 = *(uint *)(input + 8) ^ puVar4[2];
  uVar7 = *(uint *)(input + 0xc) ^ puVar4[3];
  puVar4 = puVar4 + 4;
  iVar8 = ctx->nr >> 1;
  if (1 < iVar8) {
    uVar9 = iVar8 + 1;
    do {
      local_48 = uVar9;
      uVar11 = RT0[uVar5 & 0xff] ^ *puVar4 ^ RT1[uVar7 >> 8 & 0xff] ^
               *(uint *)((long)RT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ RT3[uVar6 >> 0x18];
      uVar12 = RT0[uVar6 & 0xff] ^ puVar4[1] ^ RT1[uVar5 >> 8 & 0xff] ^
               *(uint *)((long)RT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ RT3[uVar10 >> 0x18];
      uVar9 = RT0[uVar10 & 0xff] ^ puVar4[2] ^ RT1[uVar6 >> 8 & 0xff] ^
              *(uint *)((long)RT2 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ RT3[uVar7 >> 0x18];
      uVar7 = RT0[uVar7 & 0xff] ^ puVar4[3] ^ RT1[uVar10 >> 8 & 0xff] ^
              *(uint *)((long)RT2 + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ RT3[uVar5 >> 0x18];
      uVar5 = RT0[uVar11 & 0xff] ^ puVar4[4] ^ RT1[uVar7 >> 8 & 0xff] ^
              *(uint *)((long)RT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ RT3[uVar12 >> 0x18];
      uVar6 = RT0[uVar12 & 0xff] ^ puVar4[5] ^ RT1[uVar11 >> 8 & 0xff] ^
              *(uint *)((long)RT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ RT3[uVar9 >> 0x18];
      uVar10 = RT0[uVar9 & 0xff] ^ puVar4[6] ^ RT1[uVar12 >> 8 & 0xff] ^
               *(uint *)((long)RT2 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^ RT3[uVar7 >> 0x18];
      uVar7 = RT0[uVar7 & 0xff] ^ puVar4[7] ^ RT1[uVar9 >> 8 & 0xff] ^
              *(uint *)((long)RT2 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^ RT3[uVar11 >> 0x18];
      puVar4 = puVar4 + 8;
      uVar9 = local_48 - 1;
    } while (2 < local_48 - 1);
  }
  local_58 = RT0[uVar5 & 0xff] ^ *puVar4 ^ RT1[uVar7 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ RT3[uVar6 >> 0x18];
  local_5c = RT0[uVar6 & 0xff] ^ puVar4[1] ^ RT1[uVar5 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ RT3[uVar10 >> 0x18];
  local_60 = RT0[uVar10 & 0xff] ^ puVar4[2] ^ RT1[uVar6 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ RT3[uVar7 >> 0x18];
  local_64 = RT0[uVar7 & 0xff] ^ puVar4[3] ^ RT1[uVar10 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ RT3[uVar5 >> 0x18];
  local_4c = ((uint)RSb[local_5c >> 0x18] << 0x18 |
             (uint)RSb[local_60 >> 0x10 & 0xff] << 0x10 | (uint)RSb[local_64 >> 8 & 0xff] << 8) ^
             (uint)RSb[local_58 & 0xff] ^ puVar4[4];
  bVar1 = RSb[local_5c & 0xff];
  uVar5 = puVar4[5];
  local_50 = ((uint)RSb[local_60 >> 0x18] << 0x18 |
             (uint)RSb[local_64 >> 0x10 & 0xff] << 0x10 | (uint)RSb[local_58 >> 8 & 0xff] << 8) ^
             bVar1 ^ uVar5;
  bVar2 = RSb[local_60 & 0xff];
  uVar6 = puVar4[6];
  local_38 = puVar4 + 8;
  local_54 = ((uint)RSb[local_64 >> 0x18] << 0x18 |
             (uint)RSb[local_58 >> 0x10 & 0xff] << 0x10 | (uint)RSb[local_5c >> 8 & 0xff] << 8) ^
             bVar2 ^ uVar6;
  bVar3 = RSb[local_64 & 0xff];
  uVar7 = puVar4[7];
  local_44 = ((uint)RSb[local_58 >> 0x18] << 0x18 |
             (uint)RSb[local_5c >> 0x10 & 0xff] << 0x10 | (uint)RSb[local_60 >> 8 & 0xff] << 8) ^
             bVar3 ^ uVar7;
  *output = (uchar)((uint)RSb[local_58 & 0xff] ^ puVar4[4]);
  output[1] = (uchar)(local_4c >> 8);
  output[2] = (uchar)(local_4c >> 0x10);
  output[3] = (uchar)(local_4c >> 0x18);
  output[4] = (uchar)(bVar1 ^ uVar5);
  output[5] = (uchar)(local_50 >> 8);
  output[6] = (uchar)(local_50 >> 0x10);
  output[7] = (uchar)(local_50 >> 0x18);
  output[8] = (uchar)(bVar2 ^ uVar6);
  output[9] = (uchar)(local_54 >> 8);
  output[10] = (uchar)(local_54 >> 0x10);
  output[0xb] = (uchar)(local_54 >> 0x18);
  output[0xc] = (uchar)(bVar3 ^ uVar7);
  output[0xd] = (uchar)(local_44 >> 8);
  output[0xe] = (uchar)(local_44 >> 0x10);
  output[0xf] = (uchar)(local_44 >> 0x18);
  local_40 = output;
  mbedtls_platform_zeroize(&local_4c,4);
  mbedtls_platform_zeroize(&local_50,4);
  mbedtls_platform_zeroize(&local_54,4);
  mbedtls_platform_zeroize(&local_44,4);
  mbedtls_platform_zeroize(&local_58,4);
  mbedtls_platform_zeroize(&local_5c,4);
  mbedtls_platform_zeroize(&local_60,4);
  mbedtls_platform_zeroize(&local_64,4);
  mbedtls_platform_zeroize(&local_38,8);
  return 0;
}

Assistant:

int mbedtls_internal_aes_decrypt( mbedtls_aes_context *ctx,
                                  const unsigned char input[16],
                                  unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_RROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_RROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_RROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );

    mbedtls_platform_zeroize( &X0, sizeof( X0 ) );
    mbedtls_platform_zeroize( &X1, sizeof( X1 ) );
    mbedtls_platform_zeroize( &X2, sizeof( X2 ) );
    mbedtls_platform_zeroize( &X3, sizeof( X3 ) );

    mbedtls_platform_zeroize( &Y0, sizeof( Y0 ) );
    mbedtls_platform_zeroize( &Y1, sizeof( Y1 ) );
    mbedtls_platform_zeroize( &Y2, sizeof( Y2 ) );
    mbedtls_platform_zeroize( &Y3, sizeof( Y3 ) );

    mbedtls_platform_zeroize( &RK, sizeof( RK ) );

    return( 0 );
}